

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

void CopyStat(char *input_path,char *output_path)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 auStack_b8 [4];
  int res;
  utimbuf times;
  stat statbuf;
  char *output_path_local;
  char *input_path_local;
  
  if (((input_path != (char *)0x0) && (output_path != (char *)0x0)) &&
     (iVar2 = stat(input_path,(stat *)&times.modtime), iVar2 == 0)) {
    utime(output_path,(utimbuf *)auStack_b8);
    iVar2 = chmod(output_path,(uint)statbuf.st_nlink & 0x1ff);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar3 = PrintablePath(output_path);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"setting access bits failed for [%s]: %s\n",pcVar3,pcVar5);
    }
    iVar2 = chown(output_path,0xffffffff,statbuf.st_mode);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar3 = PrintablePath(output_path);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"setting group failed for [%s]: %s\n",pcVar3,pcVar5);
    }
    iVar2 = chown(output_path,statbuf.st_nlink._4_4_,0xffffffff);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar3 = PrintablePath(output_path);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"setting user failed for [%s]: %s\n",pcVar3,pcVar5);
    }
  }
  return;
}

Assistant:

static void CopyStat(const char* input_path, const char* output_path) {
  struct stat statbuf;
  struct utimbuf times;
  int res;
  if (input_path == 0 || output_path == 0) {
    return;
  }
  if (stat(input_path, &statbuf) != 0) {
    return;
  }
  times.actime = statbuf.st_atime;
  times.modtime = statbuf.st_mtime;
  utime(output_path, &times);
  res = chmod(output_path, statbuf.st_mode & (S_IRWXU | S_IRWXG | S_IRWXO));
  if (res != 0) {
    fprintf(stderr, "setting access bits failed for [%s]: %s\n",
            PrintablePath(output_path), strerror(errno));
  }
  res = chown(output_path, (uid_t)-1, statbuf.st_gid);
  if (res != 0) {
    fprintf(stderr, "setting group failed for [%s]: %s\n",
            PrintablePath(output_path), strerror(errno));
  }
  res = chown(output_path, statbuf.st_uid, (gid_t)-1);
  if (res != 0) {
    fprintf(stderr, "setting user failed for [%s]: %s\n",
            PrintablePath(output_path), strerror(errno));
  }
}